

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalNinjaGenerator::ComputeTargetObjectDirectory
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *gt)

{
  int iVar1;
  string *a;
  undefined4 extraout_var;
  char local_7d [13];
  char *local_70;
  char local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  char local_39;
  undefined1 local_38 [8];
  string dir;
  cmGeneratorTarget *gt_local;
  cmGlobalNinjaGenerator *this_local;
  
  dir.field_2._8_8_ = gt;
  a = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(gt->LocalGenerator);
  local_39 = '/';
  (**(code **)(**(long **)(dir.field_2._8_8_ + 0x10) + 0x80))(&local_60);
  local_61 = '/';
  iVar1 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x17])();
  local_70 = (char *)CONCAT44(extraout_var,iVar1);
  local_7d[0] = '/';
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char,char_const*,char>
            ((string *)local_38,a,&local_39,&local_60,&local_61,&local_70,local_7d);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::operator=((string *)(dir.field_2._8_8_ + 0x20),(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::ComputeTargetObjectDirectory(
  cmGeneratorTarget* gt) const
{
  // Compute full path to object file directory for this target.
  std::string dir = cmStrCat(gt->LocalGenerator->GetCurrentBinaryDirectory(),
                             '/', gt->LocalGenerator->GetTargetDirectory(gt),
                             '/', this->GetCMakeCFGIntDir(), '/');
  gt->ObjectDirectory = dir;
}